

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O1

void __thiscall validation_layer::basic_leakChecker::basic_leakChecker(basic_leakChecker *this)

{
  iterator __position;
  long lVar1;
  int iVar2;
  char *__s2;
  ZEbasic_leakChecker *this_00;
  undefined8 *puVar3;
  validationChecker *local_18;
  
  this->enablebasic_leak = false;
  __s2 = getenv("ZEL_ENABLE_BASIC_LEAK_CHECKER");
  if ((__s2 == (char *)0x0) || (iVar2 = strcmp("0",__s2), iVar2 == 0)) {
    this->enablebasic_leak = false;
    return;
  }
  iVar2 = strcmp("1",__s2);
  this->enablebasic_leak = iVar2 == 0;
  if (iVar2 != 0) {
    return;
  }
  this_00 = (ZEbasic_leakChecker *)operator_new(0x40);
  ZEbasic_leakChecker::ZEbasic_leakChecker(this_00);
  puVar3 = (undefined8 *)operator_new(8);
  *puVar3 = &PTR_zesInitPrologue_001f9e60;
  DAT_00201568 = (undefined8 *)operator_new(8);
  *DAT_00201568 = &PTR_zetModuleGetDebugInfoPrologue_001fa7e8;
  lVar1 = context;
  local_18 = (validationChecker *)&basic_leak_checker;
  __position._M_current = *(validationChecker ***)(context + 0xd38);
  basic_leak_checker = this_00;
  DAT_00201560 = puVar3;
  if (__position._M_current != *(validationChecker ***)(context + 0xd40)) {
    *__position._M_current = (validationChecker *)&basic_leak_checker;
    *(long *)(lVar1 + 0xd38) = *(long *)(lVar1 + 0xd38) + 8;
    return;
  }
  std::
  vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
  ::_M_realloc_insert<validation_layer::validationChecker*>
            ((vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
              *)(context + 0xd30),__position,&local_18);
  return;
}

Assistant:

basic_leakChecker::basic_leakChecker() {
        enablebasic_leak = getenv_tobool( "ZEL_ENABLE_BASIC_LEAK_CHECKER" );
        if(enablebasic_leak) {
            basic_leakChecker::ZEbasic_leakChecker *zeChecker = new basic_leakChecker::ZEbasic_leakChecker;
            basic_leakChecker::ZESbasic_leakChecker *zesChecker = new basic_leakChecker::ZESbasic_leakChecker;
            basic_leakChecker::ZETbasic_leakChecker *zetChecker = new basic_leakChecker::ZETbasic_leakChecker;
            basic_leak_checker.zeValidation = zeChecker;
            basic_leak_checker.zetValidation = zetChecker;
            basic_leak_checker.zesValidation = zesChecker;
            validation_layer::context.validationHandlers.push_back(&basic_leak_checker);
        }
    }